

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyi_generator.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::python::PyiGenerator::GetFieldType_abi_cxx11_
          (string *__return_storage_ptr__,PyiGenerator *this,FieldDescriptor *field_des,
          Descriptor *containing_des)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  bool bVar1;
  CppType CVar2;
  Type TVar3;
  EnumDescriptor *descriptor;
  Descriptor *pDVar4;
  FileDescriptor *this_00;
  LogMessage *pLVar5;
  AlphaNum *in_R8;
  string_view sVar6;
  LogMessage local_160;
  Voidify local_149;
  AlphaNum local_148;
  AlphaNum local_118;
  AlphaNum local_e8;
  string local_b8;
  string_view local_98;
  undefined1 local_88 [8];
  string module;
  allocator<char> local_40;
  allocator<char> local_3f;
  allocator<char> local_3e;
  allocator<char> local_3d [20];
  allocator<char> local_29;
  Descriptor *local_28;
  Descriptor *containing_des_local;
  FieldDescriptor *field_des_local;
  PyiGenerator *this_local;
  string *name;
  
  local_28 = containing_des;
  containing_des_local = (Descriptor *)field_des;
  field_des_local = (FieldDescriptor *)this;
  this_local = (PyiGenerator *)__return_storage_ptr__;
  CVar2 = FieldDescriptor::cpp_type(field_des);
  switch(CVar2) {
  case CPPTYPE_INT32:
  case CPPTYPE_INT64:
  case CPPTYPE_UINT32:
  case CPPTYPE_UINT64:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"int",&local_29);
    std::allocator<char>::~allocator(&local_29);
    break;
  case CPPTYPE_DOUBLE:
  case CPPTYPE_FLOAT:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"float",local_3d);
    std::allocator<char>::~allocator(local_3d);
    break;
  case CPPTYPE_BOOL:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"bool",&local_3e);
    std::allocator<char>::~allocator(&local_3e);
    break;
  case CPPTYPE_ENUM:
    descriptor = FieldDescriptor::enum_type((FieldDescriptor *)containing_des_local);
    ModuleLevelName<google::protobuf::EnumDescriptor>(__return_storage_ptr__,this,descriptor);
    break;
  case CPPTYPE_STRING:
    TVar3 = FieldDescriptor::type((FieldDescriptor *)containing_des_local);
    if (TVar3 == TYPE_STRING) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"str",&local_3f);
      std::allocator<char>::~allocator(&local_3f);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"bytes",&local_40);
      std::allocator<char>::~allocator(&local_40);
    }
    break;
  case CPPTYPE_MESSAGE:
    pDVar4 = FieldDescriptor::message_type((FieldDescriptor *)containing_des_local);
    ModuleLevelName<google::protobuf::Descriptor>(__return_storage_ptr__,this,pDVar4);
    pDVar4 = Descriptor::containing_type(local_28);
    if (pDVar4 != (Descriptor *)0x0) {
      __x = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
            std::__cxx11::string::operator_cast_to_basic_string_view
                      ((string *)__return_storage_ptr__);
      sVar6 = Descriptor::name(local_28);
      module.field_2._8_8_ = sVar6._M_len;
      bVar1 = std::operator==(__x,sVar6);
      if (bVar1) {
        this_00 = FieldDescriptor::file((FieldDescriptor *)containing_des_local);
        local_98 = FileDescriptor::name(this_00);
        sVar6._M_len = local_98._M_str;
        sVar6._M_str = (char *)local_98._M_len;
        ModuleName_abi_cxx11_((string *)local_88,(python *)local_98._M_len,sVar6);
        absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
                  (&local_e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
        absl::lts_20250127::AlphaNum::AlphaNum(&local_118,".");
        absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
                  (&local_148,__return_storage_ptr__);
        absl::lts_20250127::StrCat_abi_cxx11_
                  (&local_b8,(lts_20250127 *)&local_e8,&local_118,&local_148,in_R8);
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_b8);
        std::__cxx11::string::~string((string *)&local_b8);
        std::__cxx11::string::~string((string *)local_88);
      }
    }
    break;
  default:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_160,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/python/pyi_generator.cc"
               ,0x18a);
    pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_160);
    pLVar5 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar5,(char (*) [24])"Unsupported field type.");
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_149,pLVar5);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_160);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string PyiGenerator::GetFieldType(
    const FieldDescriptor& field_des, const Descriptor& containing_des) const {
  switch (field_des.cpp_type()) {
    case FieldDescriptor::CPPTYPE_INT32:
    case FieldDescriptor::CPPTYPE_UINT32:
    case FieldDescriptor::CPPTYPE_INT64:
    case FieldDescriptor::CPPTYPE_UINT64:
      return "int";
    case FieldDescriptor::CPPTYPE_DOUBLE:
    case FieldDescriptor::CPPTYPE_FLOAT:
      return "float";
    case FieldDescriptor::CPPTYPE_BOOL:
      return "bool";
    case FieldDescriptor::CPPTYPE_ENUM:
      return ModuleLevelName(*field_des.enum_type());
    case FieldDescriptor::CPPTYPE_STRING:
      if (field_des.type() == FieldDescriptor::TYPE_STRING) {
        return "str";
      } else {
        return "bytes";
      }
    case FieldDescriptor::CPPTYPE_MESSAGE: {
      // If the field is inside a nested message and the nested message has the
      // same name as a top-level message, then we need to prefix the field type
      // with the module name for disambiguation.
      std::string name = ModuleLevelName(*field_des.message_type());
      if ((containing_des.containing_type() != nullptr &&
           name == containing_des.name())) {
        std::string module = ModuleName(field_des.file()->name());
        name = absl::StrCat(module, ".", name);
      }
      return name;
    }
    default:
      ABSL_LOG(FATAL) << "Unsupported field type.";
  }
  return "";
}